

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgcnt(fitsfile *fptr,char *value,char *comm,int *status)

{
  int iVar1;
  char local_d8 [8];
  char strval [71];
  char local_88 [8];
  char card [81];
  int tstatus;
  int *status_local;
  char *comm_local;
  char *value_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    card[0x4c] = '\0';
    card[0x4d] = '\0';
    card[0x4e] = '\0';
    card[0x4f] = '\0';
    *value = '\0';
    unique0x100000f7 = status;
    iVar1 = ffgnky(fptr,local_88,(int *)(card + 0x4c));
    if (iVar1 < 1) {
      iVar1 = strncmp(local_88,"CONTINUE  ",10);
      if (iVar1 == 0) {
        strncpy(local_88,"D2345678=  ",10);
        ffpsvc(local_88,local_d8,comm,(int *)(card + 0x4c));
        ffc2s(local_d8,value,(int *)(card + 0x4c));
        if (card._76_4_ != 0) {
          *value = '\0';
        }
      }
      else {
        ffmrky(fptr,-1,stack0xffffffffffffffd0);
      }
      fptr_local._4_4_ = *stack0xffffffffffffffd0;
    }
    else {
      fptr_local._4_4_ = *stack0xffffffffffffffd0;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgcnt( fitsfile *fptr,     /* I - FITS file pointer         */
            char *value,        /* O - continued string value    */
            char *comm,         /* O - continued comment string  */
            int  *status)       /* IO - error status             */
/*
  Attempt to read the next keyword, returning the string value
  if it is a continuation of the previous string keyword value.
  This uses the HEASARC convention for continuing long string values
  over multiple keywords.  Each continued string is terminated with a
  backslash character, and the continuation follows on the next keyword
  which must have the name CONTINUE without an equal sign in column 9
  of the card.  If the next card is not a continuation, then the returned
  value string will be null.
*/
{
    int tstatus;
    char card[FLEN_CARD], strval[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    tstatus = 0;
    value[0] = '\0';

    if (ffgnky(fptr, card, &tstatus) > 0)  /*  read next keyword  */
        return(*status);                   /*  hit end of header  */

    if (strncmp(card, "CONTINUE  ", 10) == 0)  /* a continuation card? */
    {
        strncpy(card, "D2345678=  ", 10); /* overwrite a dummy keyword name */
        ffpsvc(card, strval, comm, &tstatus);  /*  get the string value & comment */
        ffc2s(strval, value, &tstatus);    /* remove the surrounding quotes */

        if (tstatus)       /*  return null if error status was returned  */
           value[0] = '\0';
    }
    else
        ffmrky(fptr, -1, status);  /* reset the keyword pointer */

    return(*status);
}